

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int string_cmp_chars(http_string_t string,char *chars)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = strlen(chars);
  if (sVar2 == string.len) {
    iVar1 = nh_string_cmp(string.value,chars,(int)string.len);
    return iVar1;
  }
  return 0;
}

Assistant:

int string_cmp_chars(http_string_t string, char const chars[static 1]) {
    return strlen(chars) == string.len && nh_string_cmp(string.value, chars, string.len);
}